

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O2

void send_features(io_buf *b,example *ec,uint32_t mask)

{
  byte index;
  byte *pbVar1;
  byte *pbVar2;
  
  output_byte(b,((char)*(undefined4 *)&(ec->super_example_predict).indices._end -
                (char)*(undefined4 *)&(ec->super_example_predict).indices._begin) + 0xff);
  pbVar1 = (ec->super_example_predict).indices._end;
  for (pbVar2 = (ec->super_example_predict).indices._begin; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    index = *pbVar2;
    if ((ulong)index != 0x80) {
      output_features(b,index,(ec->super_example_predict).feature_space + index,(ulong)mask);
    }
  }
  (*b->_vptr_io_buf[7])(b);
  return;
}

Assistant:

void send_features(io_buf* b, example& ec, uint32_t mask)
{
  // note: subtracting 1 b/c not sending constant
  output_byte(*b, (unsigned char)(ec.indices.size() - 1));

  for (namespace_index ns : ec.indices)
  {
    if (ns == constant_namespace)
      continue;
    output_features(*b, ns, ec.feature_space[ns], mask);
  }
  b->flush();
}